

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.hpp
# Opt level: O2

void __thiscall
SymbolTable::SymbolTable
          (SymbolTable *this,string *name,SymbolType *type,string *previous_level_name,
          int base_address)

{
  (this->m_symbol_table).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTableTerm>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTableTerm>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_symbol_table).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTableTerm>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTableTerm>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_symbol_table).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTableTerm>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTableTerm>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->m_table_name,(string *)name);
  std::__cxx11::string::string((string *)&this->m_previous_level_name,(string *)previous_level_name)
  ;
  this->m_table_type = *type;
  this->m_table_base_address = base_address;
  this->m_table_address_length = 0;
  return;
}

Assistant:

SymbolTable(const string& name, const SymbolType& type, const string& previous_level_name, int base_address) 
        : m_table_name(name), m_table_type(type), m_previous_level_name(previous_level_name), m_table_base_address(base_address) {
            m_table_address_length = 0;
        }